

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O0

bool QGifHandler::canRead(QIODevice *device)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  char head [6];
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QMessageLogger *in_stack_ffffffffffffffc0;
  undefined4 local_1e;
  undefined2 local_1a;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcGif();
    anon_unknown.dwarf_2b5ab::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT17(in_stack_ffffffffffffffaf,
                               CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_2b5ab::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x107f17);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
                 (char *)0x107f2d);
      QMessageLogger::warning
                (&stack0xffffffffffffffc0,"QGifHandler::canRead() called with no device");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    bVar1 = false;
  }
  else {
    local_1e = 0xaaaaaaaa;
    local_1a = 0xaaaa;
    lVar3 = QIODevice::peek((char *)in_RDI,(longlong)&local_1e);
    if (lVar3 == 6) {
      iVar2 = qstrncmp((char *)in_stack_ffffffffffffffc0,
                       (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       (size_t)in_RDI);
      bVar1 = true;
      if (iVar2 != 0) {
        iVar2 = qstrncmp((char *)in_stack_ffffffffffffffc0,
                         (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                         (size_t)in_RDI);
        bVar1 = iVar2 == 0;
      }
    }
    else {
      bVar1 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QGifHandler::canRead(QIODevice *device)
{
    if (!device) {
        qCWarning(lcGif, "QGifHandler::canRead() called with no device");
        return false;
    }

    char head[6];
    if (device->peek(head, sizeof(head)) == sizeof(head))
        return qstrncmp(head, "GIF87a", 6) == 0
            || qstrncmp(head, "GIF89a", 6) == 0;
    return false;
}